

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# public_util.h
# Opt level: O1

type dukglue_pcall<void,DukValue,int,int>(duk_context *ctx,DukValue *obj,int args,int args_1)

{
  duk_int_t return_code;
  DukErrorException *this;
  SafeCallData<void,_DukValue,_int,_int> data;
  DukValue *local_30;
  int local_28;
  int local_24;
  undefined8 local_20;
  
  local_20 = 0;
  local_30 = obj;
  local_28 = args_1;
  local_24 = args;
  return_code = duk_safe_call(ctx,dukglue::detail::call_safe<void,DukValue,int,int>,&local_30,0,1);
  if (return_code == 0) {
    duk_pop(ctx);
    return;
  }
  this = (DukErrorException *)__cxa_allocate_exception(0x28);
  DukErrorException::DukErrorException(this,ctx,return_code,true);
  __cxa_throw(this,&DukErrorException::typeinfo,DukException::~DukException);
}

Assistant:

typename std::enable_if<std::is_void<RetT>::value, RetT>::type dukglue_pcall(duk_context* ctx, const ObjT& obj, ArgTs... args)
{
	dukglue::detail::SafeCallData<RetT, ObjT, ArgTs...> data{
		&obj, std::tuple<ArgTs...>(args...), nullptr
	};

	duk_int_t rc = duk_safe_call(ctx, &dukglue::detail::call_safe<RetT, ObjT, ArgTs...>, (void*) &data, 0, 1);
	if (rc != 0)
		throw DukErrorException(ctx, rc);
	duk_pop(ctx);  // remove result from stack
}